

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_constraints.cc
# Opt level: O0

bool __thiscall bssl::NameConstraints::IsPermittedDNSName(NameConstraints *this,string_view name)

{
  string_view dns_constraint;
  string_view dns_constraint_00;
  bool bVar1;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *pvVar2;
  reference pbVar3;
  basic_string_view<char,_std::char_traits<char>_> *permitted_name;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *__range1_1;
  basic_string_view<char,_std::char_traits<char>_> *excluded_name;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *__range1;
  NameConstraints *this_local;
  string_view name_local;
  
  pvVar2 = &(this->excluded_subtrees_).dns_names;
  __end1 = ::std::
           vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ::begin(pvVar2);
  excluded_name =
       (basic_string_view<char,_std::char_traits<char>_> *)
       ::std::
       vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
       ::end(pvVar2);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                                *)&excluded_name);
    if (!bVar1) {
      if (((this->permitted_subtrees_).present_name_types & 4U) == 0) {
        name_local._M_str._7_1_ = true;
      }
      else {
        pvVar2 = &(this->permitted_subtrees_).dns_names;
        __end1_1 = ::std::
                   vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ::begin(pvVar2);
        permitted_name =
             (basic_string_view<char,_std::char_traits<char>_> *)
             ::std::
             vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ::end(pvVar2);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end1_1,
                                  (__normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                                   *)&permitted_name), bVar1) {
          pbVar3 = __gnu_cxx::
                   __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                   ::operator*(&__end1_1);
          dns_constraint_00._M_len = pbVar3->_M_len;
          dns_constraint_00._M_str = pbVar3->_M_str;
          bVar1 = anon_unknown_0::DNSNameMatches(name,dns_constraint_00,WILDCARD_FULL_MATCH);
          if (bVar1) {
            return true;
          }
          __gnu_cxx::
          __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
          ::operator++(&__end1_1);
        }
        name_local._M_str._7_1_ = false;
      }
      return name_local._M_str._7_1_;
    }
    pbVar3 = __gnu_cxx::
             __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
             ::operator*(&__end1);
    dns_constraint._M_len = pbVar3->_M_len;
    dns_constraint._M_str = pbVar3->_M_str;
    bVar1 = anon_unknown_0::DNSNameMatches(name,dns_constraint,WILDCARD_PARTIAL_MATCH);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    ::operator++(&__end1);
  }
  return false;
}

Assistant:

bool NameConstraints::IsPermittedDNSName(std::string_view name) const {
  for (const auto &excluded_name : excluded_subtrees_.dns_names) {
    // When matching wildcard hosts against excluded subtrees, consider it a
    // match if the constraint would match any expansion of the wildcard. Eg,
    // *.bar.com should match a constraint of foo.bar.com.
    if (DNSNameMatches(name, excluded_name, WILDCARD_PARTIAL_MATCH)) {
      return false;
    }
  }

  // If permitted subtrees are not constrained, any name that is not excluded is
  // allowed.
  if (!(permitted_subtrees_.present_name_types & GENERAL_NAME_DNS_NAME)) {
    return true;
  }

  for (const auto &permitted_name : permitted_subtrees_.dns_names) {
    // When matching wildcard hosts against permitted subtrees, consider it a
    // match only if the constraint would match all expansions of the wildcard.
    // Eg, *.bar.com should match a constraint of bar.com, but not foo.bar.com.
    if (DNSNameMatches(name, permitted_name, WILDCARD_FULL_MATCH)) {
      return true;
    }
  }

  return false;
}